

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::SystemVerilogCodeGen(SystemVerilogCodeGen *this,Generator *generator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SystemVerilogCodeGenOptions local_70;
  
  paVar1 = &local_70.package_name.field_2;
  local_70.unique_case = true;
  local_70.yosys_src = false;
  local_70.package_name._M_string_length = 0;
  local_70.package_name.field_2._M_local_buf[0] = '\0';
  local_70.line_wrap = 0x50;
  paVar2 = &local_70.output_dir.field_2;
  local_70.output_dir._M_string_length = 0;
  local_70.output_dir.field_2._M_local_buf[0] = '\0';
  local_70.extract_debug_info = false;
  local_70.package_name._M_dataplus._M_p = (pointer)paVar1;
  local_70.output_dir._M_dataplus._M_p = (pointer)paVar2;
  SystemVerilogCodeGen(this,generator,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.output_dir._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.output_dir._M_dataplus._M_p,
                    CONCAT71(local_70.output_dir.field_2._M_allocated_capacity._1_7_,
                             local_70.output_dir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.package_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.package_name._M_dataplus._M_p,
                    CONCAT71(local_70.package_name.field_2._M_allocated_capacity._1_7_,
                             local_70.package_name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

SystemVerilogCodeGen::SystemVerilogCodeGen(Generator* generator)
    : SystemVerilogCodeGen(generator, {}) {}